

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxTextureUnitsTest::getShaderParts
          (GeometryShaderMaxTextureUnitsTest *this,GLchar ***out_fragment_shader_parts,
          uint *out_n_fragment_shader_parts,GLchar ***out_geometry_shader_parts,
          uint *out_n_geometry_shader_parts,GLchar ***out_vertex_shader_parts,
          uint *out_n_vertex_shader_parts)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  GLchar *pGVar3;
  string local_1f8 [48];
  stringstream local_1c8 [8];
  stringstream stream;
  undefined1 local_1b8 [376];
  long local_40;
  Functions *gl;
  GLchar ***out_vertex_shader_parts_local;
  uint *out_n_geometry_shader_parts_local;
  GLchar ***out_geometry_shader_parts_local;
  uint *out_n_fragment_shader_parts_local;
  GLchar ***out_fragment_shader_parts_local;
  GeometryShaderMaxTextureUnitsTest *this_local;
  
  gl = (Functions *)out_vertex_shader_parts;
  out_vertex_shader_parts_local = (GLchar ***)out_n_geometry_shader_parts;
  out_n_geometry_shader_parts_local = (uint *)out_geometry_shader_parts;
  out_geometry_shader_parts_local = (GLchar ***)out_n_fragment_shader_parts;
  out_n_fragment_shader_parts_local = (uint *)out_fragment_shader_parts;
  out_fragment_shader_parts_local = (GLchar ***)this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_40 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_40 + 0x868))
            ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_glExtTokens.
             MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,&this->m_max_texture_units);
  err = (**(code **)(local_40 + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x95e);
  this->m_texture_width = this->m_max_texture_units * 2;
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::ostream::operator<<(local_1b8,this->m_max_texture_units);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_max_texture_units_string,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  *(undefined ***)out_n_fragment_shader_parts_local = &m_fragment_shader_code;
  *(undefined4 *)out_geometry_shader_parts_local = 1;
  this->m_geometry_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n${GEOMETRY_POINT_SIZE_ENABLE}\n${GPU_SHADER5_REQUIRE}\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\n#define NUMBER_OF_POINTS "
  ;
  pGVar3 = (GLchar *)std::__cxx11::string::c_str();
  this->m_geometry_shader_parts[1] = pGVar3;
  this->m_geometry_shader_parts[2] =
       "u\n\n// NUMBER_OF_POINTS == NUMBER_OF_SAMPLERS\n     uniform lowp isampler2D gs_texture[NUMBER_OF_POINTS];\nflat in      int        vs_gs_vertex_id[1];\nflat out     int        gs_fs_color;\n\nvoid main()\n{\n    float half_of_edge = (1.0 / float(NUMBER_OF_POINTS));\n    int   color        = 0;\n\n    for (uint i = 0u; i <= uint(vs_gs_vertex_id[0]); ++i)\n    {\n        color += texture(gs_texture[i], vec2(0.0, 0.0)).r;\n    }\n\n    gl_Position = gl_in[0].gl_Position + vec4(-half_of_edge,  1.0, 0, 0);\n    gs_fs_color = color;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4( half_of_edge,  1.0, 0, 0);\n    gs_fs_color = color;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4(-half_of_edge, -1.0, 0, 0);\n    gs_fs_color = color;\n    EmitVertex();\n\n    gl_Position = gl_in[0].gl_Position + vec4( half_of_edge, -1.0, 0, 0);\n    gs_fs_color = color;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  *(GLchar ***)out_n_geometry_shader_parts_local = this->m_geometry_shader_parts;
  *(undefined4 *)out_vertex_shader_parts_local = 3;
  this->m_vertex_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\n#define NUMBER_OF_POINTS "
  ;
  pGVar3 = (GLchar *)std::__cxx11::string::c_str();
  this->m_vertex_shader_parts[1] = pGVar3;
  this->m_vertex_shader_parts[2] =
       "u\n\nflat out int vs_gs_vertex_id;\n\nvoid main()\n{\n    gl_Position     = vec4(-1.0 + ((2.0 / float(NUMBER_OF_POINTS)) * float(gl_VertexID)) + (1.0 / float(NUMBER_OF_POINTS)), 0, 0, 1.0);\n    vs_gs_vertex_id = gl_VertexID;\n}\n"
  ;
  gl->activeShaderProgram = (glActiveShaderProgramFunc)this->m_vertex_shader_parts;
  *out_n_vertex_shader_parts = 3;
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return;
}

Assistant:

void GeometryShaderMaxTextureUnitsTest::getShaderParts(const glw::GLchar* const*& out_fragment_shader_parts,
													   unsigned int&			  out_n_fragment_shader_parts,
													   const glw::GLchar* const*& out_geometry_shader_parts,
													   unsigned int&			  out_n_geometry_shader_parts,
													   const glw::GLchar* const*& out_vertex_shader_parts,
													   unsigned int&			  out_n_vertex_shader_parts)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get maximum number of texture units */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &m_max_texture_units);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT pname");

	/* Number of drawn points is equal to GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT */
	m_texture_width = m_max_texture_units * m_point_size;

	/* Prepare texture units string */
	std::stringstream stream;
	stream << m_max_texture_units;
	m_max_texture_units_string = stream.str();

	/* Fragment shader parts */
	out_fragment_shader_parts   = &m_fragment_shader_code;
	out_n_fragment_shader_parts = 1;

	/* Geometry shader parts */
	m_geometry_shader_parts[0] = m_geometry_shader_code_preamble;
	m_geometry_shader_parts[1] = m_max_texture_units_string.c_str();
	m_geometry_shader_parts[2] = m_geometry_shader_code_body;

	out_geometry_shader_parts   = m_geometry_shader_parts;
	out_n_geometry_shader_parts = 3;

	/* Vertex shader parts */
	m_vertex_shader_parts[0] = m_vertex_shader_code_preamble;
	m_vertex_shader_parts[1] = m_max_texture_units_string.c_str();
	m_vertex_shader_parts[2] = m_vertex_shader_code_body;

	out_vertex_shader_parts   = m_vertex_shader_parts;
	out_n_vertex_shader_parts = 3;
}